

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureSpecificationTests.cpp
# Opt level: O3

void __thiscall
deqp::gles3::Functional::TexImage3DParamsCase::createTexture(TexImage3DParamsCase *this)

{
  ContextWrapper *this_00;
  TextureFormat *this_01;
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  int iVar5;
  int iVar6;
  TransferFormat TVar7;
  uint rowPitch;
  int iVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  deUint32 tex;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  Vec4 colorB;
  Vec4 colorA;
  PixelBufferAccess local_58;
  
  this_01 = &(this->super_Texture3DSpecCase).m_texFormat;
  TVar7 = glu::getTransferFormat((this->super_Texture3DSpecCase).m_texFormat);
  iVar5 = tcu::TextureFormat::getPixelSize(this_01);
  iVar8 = this->m_imageHeight;
  iVar6 = this->m_rowLength;
  if (iVar6 < 1) {
    iVar6 = (this->super_Texture3DSpecCase).m_width;
  }
  rowPitch = -this->m_alignment & (iVar6 * iVar5 + this->m_alignment) - 1U;
  if (iVar8 < 1) {
    iVar8 = (this->super_Texture3DSpecCase).m_height;
  }
  iVar8 = iVar8 * rowPitch;
  tex = 0;
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&data,(long)(int)(((this->super_Texture3DSpecCase).m_depth + this->m_skipImages) *
                               iVar8 + this->m_skipPixels * iVar5 + this->m_skipRows * rowPitch));
  fVar1 = (this->super_Texture3DSpecCase).m_texFormatInfo.valueMin.m_data[0];
  fVar2 = (this->super_Texture3DSpecCase).m_texFormatInfo.valueMin.m_data[1];
  fVar3 = (this->super_Texture3DSpecCase).m_texFormatInfo.valueMin.m_data[2];
  fVar4 = (this->super_Texture3DSpecCase).m_texFormatInfo.valueMin.m_data[3];
  fVar9 = (this->super_Texture3DSpecCase).m_texFormatInfo.valueMax.m_data[0] - fVar1;
  fVar10 = (this->super_Texture3DSpecCase).m_texFormatInfo.valueMax.m_data[1] - fVar2;
  fVar11 = (this->super_Texture3DSpecCase).m_texFormatInfo.valueMax.m_data[2] - fVar3;
  fVar12 = (this->super_Texture3DSpecCase).m_texFormatInfo.valueMax.m_data[3] - fVar4;
  colorA.m_data[0] = fVar9 * 1.0 + fVar1;
  colorA.m_data[1] = fVar10 * 0.0 + fVar2;
  colorA.m_data[2] = fVar11 * 0.0 + fVar3;
  colorA.m_data[3] = fVar12 * 1.0 + fVar4;
  colorB.m_data[0] = fVar9 * 0.0 + fVar1;
  colorB.m_data[1] = fVar10 * 1.0 + fVar2;
  colorB.m_data[2] = fVar11 * 0.0 + fVar3;
  colorB.m_data[3] = fVar12 * 1.0 + fVar4;
  tcu::PixelBufferAccess::PixelBufferAccess
            (&local_58,this_01,(this->super_Texture3DSpecCase).m_width,
             (this->super_Texture3DSpecCase).m_height,(this->super_Texture3DSpecCase).m_depth,
             rowPitch,iVar8,
             data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start +
             (long)(iVar5 * this->m_skipPixels) + (long)(int)(this->m_skipRows * rowPitch) +
             (long)(this->m_skipImages * iVar8));
  tcu::fillWithGrid(&local_58,4,&colorA,&colorB);
  this_00 = &(this->super_Texture3DSpecCase).super_TextureSpecCase.super_ContextWrapper;
  sglr::ContextWrapper::glPixelStorei(this_00,0x806e,this->m_imageHeight);
  sglr::ContextWrapper::glPixelStorei(this_00,0xcf2,this->m_rowLength);
  sglr::ContextWrapper::glPixelStorei(this_00,0x806d,this->m_skipImages);
  sglr::ContextWrapper::glPixelStorei(this_00,0xcf3,this->m_skipRows);
  sglr::ContextWrapper::glPixelStorei(this_00,0xcf4,this->m_skipPixels);
  sglr::ContextWrapper::glPixelStorei(this_00,0xcf5,this->m_alignment);
  sglr::ContextWrapper::glGenTextures(this_00,1,&tex);
  sglr::ContextWrapper::glBindTexture(this_00,0x806f,tex);
  sglr::ContextWrapper::glTexImage3D
            (this_00,0x806f,0,this->m_internalFormat,(this->super_Texture3DSpecCase).m_width,
             (this->super_Texture3DSpecCase).m_height,(this->super_Texture3DSpecCase).m_depth,0,
             TVar7.format,TVar7.dataType,
             data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start);
  if (data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void createTexture (void)
	{
		glu::TransferFormat		transferFmt		= glu::getTransferFormat(m_texFormat);
		int						pixelSize		= m_texFormat.getPixelSize();
		int						rowLength		= m_rowLength > 0 ? m_rowLength : m_width;
		int						rowPitch		= deAlign32(rowLength*pixelSize, m_alignment);
		int						imageHeight		= m_imageHeight > 0 ? m_imageHeight : m_height;
		int						slicePitch		= imageHeight*rowPitch;
		deUint32				tex				= 0;
		vector<deUint8>			data;

		DE_ASSERT(m_numLevels == 1);

		// Fill data with grid.
		data.resize(pixelSize * m_skipPixels + rowPitch * m_skipRows + slicePitch * (m_skipImages + m_depth));
		{
			Vec4	cScale		= m_texFormatInfo.valueMax-m_texFormatInfo.valueMin;
			Vec4	cBias		= m_texFormatInfo.valueMin;
			Vec4	colorA		= Vec4(1.0f, 0.0f, 0.0f, 1.0f)*cScale + cBias;
			Vec4	colorB		= Vec4(0.0f, 1.0f, 0.0f, 1.0f)*cScale + cBias;

			tcu::fillWithGrid(tcu::PixelBufferAccess(m_texFormat, m_width, m_height, m_depth, rowPitch, slicePitch, &data[0] + m_skipImages*slicePitch + m_skipRows*rowPitch + m_skipPixels*pixelSize), 4, colorA, colorB);
		}

		glPixelStorei(GL_UNPACK_IMAGE_HEIGHT,	m_imageHeight);
		glPixelStorei(GL_UNPACK_ROW_LENGTH,		m_rowLength);
		glPixelStorei(GL_UNPACK_SKIP_IMAGES,	m_skipImages);
		glPixelStorei(GL_UNPACK_SKIP_ROWS,		m_skipRows);
		glPixelStorei(GL_UNPACK_SKIP_PIXELS,	m_skipPixels);
		glPixelStorei(GL_UNPACK_ALIGNMENT,		m_alignment);

		glGenTextures(1, &tex);
		glBindTexture(GL_TEXTURE_3D, tex);
		glTexImage3D(GL_TEXTURE_3D, 0, m_internalFormat, m_width, m_height, m_depth, 0, transferFmt.format, transferFmt.dataType, &data[0]);
	}